

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

void xmlParseXMLCatalogNodeList
               (xmlNodePtr cur,xmlCatalogPrefer prefer,xmlCatalogEntryPtr parent,
               xmlCatalogEntryPtr cgroup)

{
  _xmlCatalogEntry *p_Var1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *name;
  xmlCatalogEntryPtr cgroup_00;
  _xmlCatalogEntry *p_Var4;
  char *attrName;
  _xmlCatalogEntry *p_Var5;
  char *name_00;
  xmlCatalogPrefer xVar6;
  xmlCatalogEntryType type;
  xmlCatalogPrefer prefer_00;
  
  do {
    if (cur == (xmlNode *)0x0) {
      return;
    }
    if ((cur->ns != (xmlNs *)0x0) && (pxVar3 = cur->ns->href, pxVar3 != (xmlChar *)0x0)) {
      iVar2 = xmlStrEqual(pxVar3,(xmlChar *)"urn:oasis:names:tc:entity:xmlns:xml:catalog");
      if (iVar2 != 0) {
        iVar2 = xmlStrEqual(cur->name,"group");
        xVar6 = prefer;
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(cur->name,(xmlChar *)"public");
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual(cur->name,"system");
            if (iVar2 != 0) {
              type = XML_CATA_SYSTEM;
              name_00 = "system";
              attrName = "systemId";
              goto LAB_00161156;
            }
            iVar2 = xmlStrEqual(cur->name,(xmlChar *)"rewriteSystem");
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual(cur->name,(xmlChar *)"delegatePublic");
              if (iVar2 == 0) {
                iVar2 = xmlStrEqual(cur->name,(xmlChar *)"delegateSystem");
                if (iVar2 == 0) {
                  name_00 = "uri";
                  iVar2 = xmlStrEqual(cur->name,"uri");
                  if (iVar2 != 0) {
                    type = XML_CATA_URI;
                    attrName = "name";
                    pxVar3 = (xmlChar *)name_00;
                    goto LAB_0016115d;
                  }
                  name_00 = "rewriteURI";
                  iVar2 = xmlStrEqual(cur->name,(xmlChar *)"rewriteURI");
                  if (iVar2 != 0) {
                    type = XML_CATA_REWRITE_URI;
                    attrName = "uriStartString";
                    goto LAB_00161209;
                  }
                  name_00 = "delegateURI";
                  iVar2 = xmlStrEqual(cur->name,(xmlChar *)"delegateURI");
                  if (iVar2 == 0) {
                    iVar2 = xmlStrEqual(cur->name,(xmlChar *)"nextCatalog");
                    if (iVar2 == 0) goto LAB_001611d0;
                    type = XML_CATA_NEXT_CATALOG;
                    name_00 = "nextCatalog";
                    attrName = (char *)0x0;
                  }
                  else {
                    type = XML_CATA_DELEGATE_URI;
                    attrName = "uriStartString";
                  }
                }
                else {
                  type = XML_CATA_DELEGATE_SYSTEM;
                  name_00 = "delegateSystem";
                  attrName = "systemIdStartString";
                }
              }
              else {
                type = XML_CATA_DELEGATE_PUBLIC;
                name_00 = "delegatePublic";
                attrName = "publicIdStartString";
              }
              pxVar3 = "catalog";
            }
            else {
              type = XML_CATA_REWRITE_SYSTEM;
              name_00 = "rewriteSystem";
              attrName = "systemIdStartString";
LAB_00161209:
              pxVar3 = (xmlChar *)"rewritePrefix";
            }
          }
          else {
            type = XML_CATA_PUBLIC;
            name_00 = "public";
            attrName = "publicId";
LAB_00161156:
            pxVar3 = "uri";
          }
LAB_0016115d:
          cgroup_00 = xmlParseXMLCatalogOneNode
                                (cur,type,(xmlChar *)name_00,(xmlChar *)attrName,pxVar3,prefer,
                                 cgroup);
          pxVar3 = (xmlChar *)0x0;
        }
        else {
          pxVar3 = xmlGetProp(cur,(xmlChar *)"prefer");
          if (pxVar3 == (xmlChar *)0x0) {
            prefer_00 = XML_CATA_PREFER_NONE;
          }
          else {
            iVar2 = xmlStrEqual(pxVar3,"system");
            prefer_00 = XML_CATA_PREFER_SYSTEM;
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual(pxVar3,(xmlChar *)"public");
              prefer_00 = XML_CATA_PREFER_PUBLIC;
              if (iVar2 == 0) {
                xmlCatalogErr(parent,cur,0x674,"Invalid value for prefer: \'%s\'\n",pxVar3,
                              (xmlChar *)0x0,(xmlChar *)0x0);
                prefer_00 = prefer;
              }
            }
            (*xmlFree)(pxVar3);
            xVar6 = prefer_00;
          }
          name = xmlGetProp(cur,"id");
          pxVar3 = xmlGetNsProp(cur,"base",(xmlChar *)"http://www.w3.org/XML/1998/namespace");
          cgroup_00 = xmlNewCatalogEntry(XML_CATA_GROUP,name,pxVar3,(xmlChar *)0x0,prefer_00,cgroup)
          ;
          (*xmlFree)(name);
        }
        if (cgroup_00 != (xmlCatalogEntryPtr)0x0) {
          cgroup_00->parent = parent;
          p_Var1 = parent->children;
          p_Var5 = (_xmlCatalogEntry *)&parent->children;
          while (p_Var4 = p_Var1, p_Var4 != (_xmlCatalogEntry *)0x0) {
            p_Var5 = p_Var4;
            p_Var1 = p_Var4->next;
          }
          p_Var5->next = cgroup_00;
          if (cgroup_00->type == XML_CATA_GROUP) {
            xmlParseXMLCatalogNodeList(cur->children,xVar6,parent,cgroup_00);
          }
        }
        if (pxVar3 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar3);
        }
      }
    }
LAB_001611d0:
    cur = cur->next;
  } while( true );
}

Assistant:

static void
xmlParseXMLCatalogNodeList(xmlNodePtr cur, xmlCatalogPrefer prefer,
	                   xmlCatalogEntryPtr parent, xmlCatalogEntryPtr cgroup) {
    while (cur != NULL) {
	if ((cur->ns != NULL) && (cur->ns->href != NULL) &&
	    (xmlStrEqual(cur->ns->href, XML_CATALOGS_NAMESPACE))) {
	    xmlParseXMLCatalogNode(cur, prefer, parent, cgroup);
	}
	cur = cur->next;
    }
    /* TODO: sort the list according to REWRITE lengths and prefer value */
}